

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_data.hpp
# Opt level: O3

void duckdb::ArrowEnumData<short>::EnumAppendVector
               (ArrowAppendData *append_data,Vector *input,idx_t size)

{
  vector<duckdb::ArrowBuffer,_true> *this;
  reference this_00;
  reference this_01;
  reference buffer;
  data_ptr_t pdVar1;
  idx_t iVar2;
  ulong *puVar3;
  void *__src;
  int iVar4;
  idx_t bytes;
  long lVar5;
  undefined8 local_40;
  void *local_38;
  
  this = &append_data->arrow_buffers;
  this_00 = vector<duckdb::ArrowBuffer,_true>::operator[](this,1);
  this_01 = vector<duckdb::ArrowBuffer,_true>::operator[](this,2);
  buffer = vector<duckdb::ArrowBuffer,_true>::operator[](this,0);
  ResizeValidity(buffer,append_data->row_count + size);
  iVar2 = this_00->count + size * 4 + 4;
  ArrowBuffer::reserve(this_00,iVar2);
  this_00->count = iVar2;
  puVar3 = (ulong *)input->data;
  pdVar1 = this_00->dataptr;
  iVar2 = append_data->row_count;
  if (iVar2 == 0) {
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
  }
  if (size != 0) {
    iVar4 = *(int *)(pdVar1 + iVar2 * 4);
    iVar2 = size;
    do {
      pdVar1 = pdVar1 + 4;
      lVar5 = (long)iVar4;
      bytes = (ulong)(uint)*puVar3 + lVar5;
      iVar4 = (int)bytes;
      *(int *)(pdVar1 + append_data->row_count * 4) = iVar4;
      ArrowBuffer::reserve(this_01,bytes);
      this_01->count = bytes;
      local_40 = *puVar3;
      local_38 = (void *)puVar3[1];
      __src = local_38;
      if ((uint)local_40 < 0xd) {
        __src = (void *)((long)&local_40 + 4);
      }
      switchD_012bc561::default(this_01->dataptr + lVar5,__src,local_40 & 0xffffffff);
      puVar3 = puVar3 + 2;
      iVar2 = iVar2 - 1;
    } while (iVar2 != 0);
    iVar2 = append_data->row_count;
  }
  append_data->row_count = iVar2 + size;
  return;
}

Assistant:

static void EnumAppendVector(ArrowAppendData &append_data, const Vector &input, idx_t size) {
		D_ASSERT(input.GetVectorType() == VectorType::FLAT_VECTOR);
		auto &main_buffer = append_data.GetMainBuffer();
		auto &aux_buffer = append_data.GetAuxBuffer();
		// resize the validity mask and set up the validity buffer for iteration
		ResizeValidity(append_data.GetValidityBuffer(), append_data.row_count + size);

		// resize the offset buffer - the offset buffer holds the offsets into the child array
		main_buffer.resize(main_buffer.size() + sizeof(int32_t) * (size + 1));
		auto data = FlatVector::GetData<string_t>(input);
		auto offset_data = main_buffer.GetData<int32_t>();
		if (append_data.row_count == 0) {
			// first entry
			offset_data[0] = 0;
		}
		// now append the string data to the auxiliary buffer
		// the auxiliary buffer's length depends on the string lengths, so we resize as required
		auto last_offset = offset_data[append_data.row_count];
		for (idx_t i = 0; i < size; i++) {
			auto offset_idx = append_data.row_count + i + 1;

			auto string_length = GetLength(data[i]);

			// append the offset data
			auto current_offset = UnsafeNumericCast<idx_t>(last_offset) + string_length;
			offset_data[offset_idx] = UnsafeNumericCast<int32_t>(current_offset);

			// resize the string buffer if required, and write the string data
			aux_buffer.resize(current_offset);
			WriteData(aux_buffer.data() + last_offset, data[i]);

			last_offset = UnsafeNumericCast<int32_t>(current_offset);
		}
		append_data.row_count += size;
	}